

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall SquareSolverService::Run(SquareSolverService *this)

{
  thread consumer;
  thread local_18;
  anon_class_8_1_8991fb9c_for__M_head_impl local_10;
  
  local_10.this = this;
  std::thread::thread<SquareSolverService::Run()::_lambda()_1_,,void>(&local_18,&local_10);
  ProducerThread(this);
  StopConsumer(this);
  std::thread::join();
  if (local_18._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

void Run() {
        std::thread consumer([&](){ this->ConsumerThread(); });
        ProducerThread();
        StopConsumer();
        consumer.join();
    }